

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O3

int __thiscall amrex::AmrLevel::derive(AmrLevel *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  _func_int **pp_Var1;
  pointer pSVar2;
  FArrayBox *pFVar3;
  FArrayBox *__args_4;
  Box *pBVar4;
  AmrLevel *pAVar5;
  Geometry *pGVar6;
  Real *pRVar7;
  bool bVar8;
  int extraout_EAX;
  int iVar9;
  int iVar10;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  DeriveRec *this_00;
  DeriveBoxMap p_Var11;
  int *piVar12;
  long lVar13;
  pointer *ppbVar14;
  pointer *ppbVar15;
  DeriveFunc p_Var16;
  DeriveFunc3D p_Var17;
  int *piVar18;
  int iVar19;
  FabArrayBase *pFVar20;
  int dcomp;
  BoxArray *bxs;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int index;
  int scomp;
  int ncomp;
  FabArrayBase *local_2f8;
  Box *local_2f0;
  AmrLevel *local_2e8;
  int n_state;
  int n_der;
  int idx;
  Geometry *local_2d0;
  Box bx1;
  pointer pbStack_2a8;
  int local_2a0;
  Vector<int,_std::allocator<int>_> *local_290;
  Vector<int,_std::allocator<int>_> *local_288;
  int *local_268;
  Real *local_260;
  Box *local_258;
  IntVect *local_250;
  double *local_248;
  double *local_240;
  int *local_238;
  ulong local_230;
  Real dt;
  Real time_local;
  Box local_214;
  RealBox *local_1f8;
  DeriveFunc local_1f0;
  int *local_1e8;
  _Any_data local_1e0;
  code *local_1d0;
  MultiFab srcMF;
  
  local_2f0 = (Box *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  iVar19 = *(int *)(key + 0xc0);
  bVar8 = isStateVariable((string *)ctx,&index,&scomp);
  if (bVar8) {
    FillPatch(this,(MultiFab *)key,iVar19,(Real)local_2f0,index,scomp,1,(int)keylen);
    iVar19 = extraout_EAX;
  }
  else {
    local_2f8 = (FabArrayBase *)key;
    local_2e8 = this;
    local_230 = (ulong)keylen & 0xffffffff;
    this_00 = DeriveList::get((DeriveList *)&derive_lst,(string *)ctx);
    if (this_00 == (DeriveRec *)0x0) {
      pp_Var1 = (_func_int **)
                ((long)&srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                        m_op + 4);
      srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&srcMF,"AmrLevel::derive(MultiFab*): unknown variable: ","");
      std::__cxx11::string::_M_append((char *)&srcMF,*(ulong *)ctx);
      Error_host((char *)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                         _vptr_FabArrayBase);
      iVar19 = extraout_EAX_00;
      if (srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase != pp_Var1) {
        operator_delete(srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase
                        ,srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                         m_op._4_8_ + 1);
        iVar19 = extraout_EAX_01;
      }
    }
    else {
      DeriveRec::getRange(this_00,0,&index,&scomp,&ncomp);
      pAVar5 = local_2e8;
      pSVar2 = (local_2e8->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
               super__Vector_impl_data._M_start;
      bxs = &pSVar2[index].grids;
      BATransformer::operator()
                ((Box *)&srcMF,&bxs->m_bat,
                 *(Box **)pSVar2[index].grids.m_ref.
                          super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      p_Var11 = DeriveRec::boxMap(this_00);
      (*p_Var11)(&bx1,(Box *)&srcMF);
      iVar19 = ((int)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase -
               bx1.smallend.vect[0]) + iVar19;
      iVar9 = DeriveRec::numState(this_00);
      bx1.smallend.vect[0] = 1;
      bx1.smallend.vect[1] = 0;
      bx1.smallend.vect[2] = 0;
      bx1.bigend.vect[0] = 0;
      bx1.bigend.vect[1] = 0;
      bx1.bigend.vect[2] = 0;
      stack0xfffffffffffffd50 = (pointer)0x0;
      pbStack_2a8 = (pointer)0x0;
      MultiFab::MultiFab(&srcMF,bxs,&pAVar5->dmap,iVar9,iVar19,(MFInfo *)&bx1,
                         (pAVar5->m_factory)._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(bx1.bigend.vect + 1));
      iVar9 = DeriveRec::numRange(this_00);
      if (0 < iVar9) {
        iVar9 = 0;
        dcomp = 0;
        do {
          DeriveRec::getRange(this_00,iVar9,&index,&scomp,&ncomp);
          FillPatch(local_2e8,&srcMF,iVar19,(Real)local_2f0,index,scomp,ncomp,dcomp);
          iVar9 = iVar9 + 1;
          dcomp = dcomp + ncomp;
          iVar10 = DeriveRec::numRange(this_00);
        } while (iVar9 < iVar10);
      }
      DeriveRec::derFuncFab((DeriveFuncFab *)&bx1,this_00);
      pFVar20 = local_2f8;
      if (bx1.bigend.vect._4_8_ == 0) {
        MFIter::MFIter((MFIter *)&bx1,local_2f8,true);
        if ((int)pbStack_2a8 < local_2a0) {
          local_260 = (local_2e8->geom).super_CoordSys.dx;
          local_1f8 = &(local_2e8->geom).prob_domain;
          local_268 = &local_2e8->level;
          do {
            ppbVar15 = &pbStack_2a8;
            lVar13 = (long)(int)pbStack_2a8;
            idx = (local_290->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar13];
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              lVar13 = (long)(local_288->super_vector<int,_std::allocator<int>_>).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar13];
            }
            local_240 = BaseFab<double>::dataPtr
                                  (*(BaseFab<double> **)
                                    (*(long *)((long)&pFVar20[1].boxarray.m_bat.m_op + 0xc) +
                                    lVar13 * 8),(int)local_230);
            ppbVar14 = ppbVar15;
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar14 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)pbStack_2a8);
            }
            lVar13 = *(long *)(*(long *)((long)&pFVar20[1].boxarray.m_bat.m_op + 0xc) +
                              (long)*(int *)ppbVar14 * 8);
            MFIter::growntilebox(&local_214,(MFIter *)&bx1,-1000000);
            n_der = DeriveRec::numDerive(this_00);
            ppbVar14 = ppbVar15;
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar14 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)pbStack_2a8);
            }
            local_248 = BaseFab<double>::dataPtr
                                  (&srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar14]->
                                    super_BaseFab<double>,0);
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar15 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)pbStack_2a8);
            }
            local_238 = (int *)(lVar13 + 0x24);
            pFVar3 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar15];
            local_2f0 = &(pFVar3->super_BaseFab<double>).domain;
            local_250 = &(pFVar3->super_BaseFab<double>).domain.bigend;
            n_state = DeriveRec::numState(this_00);
            pAVar5 = local_2e8;
            pSVar2 = (local_2e8->state).
                     super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                     super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl
                     .super__Vector_impl_data._M_start;
            local_258 = &pSVar2[index].domain;
            local_2d0 = (Geometry *)&pSVar2[index].domain.bigend;
            local_1e8 = DeriveRec::getBC(this_00);
            pRVar7 = local_260;
            RealBox::RealBox((RealBox *)&local_1e0,&local_214,local_260,local_1f8->xlo);
            dt = (pAVar5->parent->dt_level).super_vector<double,_std::allocator<double>_>.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[pAVar5->level];
            p_Var16 = DeriveRec::derFunc(this_00);
            piVar12 = local_238;
            pGVar6 = local_2d0;
            pBVar4 = local_2f0;
            if (p_Var16 == (DeriveFunc)0x0) {
              p_Var17 = DeriveRec::derFunc3D(this_00);
              if (p_Var17 == (DeriveFunc3D)0x0) {
                Error_host("AmrLevel::derive: no function available");
              }
              else {
                piVar18 = DeriveRec::getBC3D(this_00);
                p_Var17 = DeriveRec::derFunc3D(this_00);
                (*p_Var17)(local_240,(int *)(lVar13 + 0x18),piVar12,&n_der,local_248,(int *)pBVar4,
                           local_250->vect,&n_state,(int *)&local_214,local_214.bigend.vect,
                           (int *)local_258,(int *)pGVar6,local_260,(Real *)&local_1e0,&time_local,
                           &dt,piVar18,local_268,&idx);
              }
            }
            else {
              local_1f0 = DeriveRec::derFunc(this_00);
              (*local_1f0)(local_240,(int *)(lVar13 + 0x18),(int *)(lVar13 + 0x1c),
                           (int *)(lVar13 + 0x20),local_238,(int *)(lVar13 + 0x28),
                           (int *)(lVar13 + 0x2c),&n_der,local_248,(int *)local_2f0,
                           (pFVar3->super_BaseFab<double>).domain.smallend.vect + 1,
                           (pFVar3->super_BaseFab<double>).domain.smallend.vect + 2,local_250->vect,
                           (pFVar3->super_BaseFab<double>).domain.bigend.vect + 1,
                           (pFVar3->super_BaseFab<double>).domain.bigend.vect + 2,&n_state,
                           (int *)&local_214,local_214.bigend.vect,(int *)local_258,(int *)local_2d0
                           ,pRVar7,(Real *)&local_1e0,&time_local,&dt,local_1e8,local_268,&idx);
            }
            pFVar20 = local_2f8;
            MFIter::operator++((MFIter *)&bx1);
          } while ((int)pbStack_2a8 < local_2a0);
        }
      }
      else {
        (*(code *)bx1.bigend.vect._4_8_)(&bx1,&bx1,3);
        pFVar20 = local_2f8;
        MFIter::MFIter((MFIter *)&bx1,local_2f8,true);
        if ((int)pbStack_2a8 < local_2a0) {
          local_2d0 = &local_2e8->geom;
          do {
            MFIter::growntilebox(&local_214,(MFIter *)&bx1,-1000000);
            ppbVar15 = &pbStack_2a8;
            if (local_288 != (Vector<int,_std::allocator<int>_> *)0x0) {
              ppbVar15 = (pointer *)
                         ((local_288->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)pbStack_2a8);
            }
            pFVar3 = *(FArrayBox **)
                      (*(long *)((long)&pFVar20[1].boxarray.m_bat.m_op + 0xc) +
                      (long)*(int *)ppbVar15 * 8);
            __args_4 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar15];
            iVar19 = DeriveRec::numDerive(this_00);
            DeriveRec::derFuncFab((DeriveFuncFab *)&local_1e0,this_00);
            piVar12 = DeriveRec::getBC(this_00);
            std::
            function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
            ::operator()((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                          *)&local_1e0,&local_214,pFVar3,(int)local_230,iVar19,__args_4,local_2d0,
                         (double)local_2f0,piVar12,local_2e8->level);
            if (local_1d0 != (code *)0x0) {
              (*local_1d0)(&local_1e0,&local_1e0,__destroy_functor);
            }
            MFIter::operator++((MFIter *)&bx1);
            pFVar20 = local_2f8;
          } while ((int)pbStack_2a8 < local_2a0);
        }
      }
      MFIter::~MFIter((MFIter *)&bx1);
      MultiFab::~MultiFab(&srcMF);
      iVar19 = extraout_EAX_02;
    }
  }
  return iVar19;
}

Assistant:

void
AmrLevel::derive (const std::string& name, Real time, MultiFab& mf, int dcomp)
{
    BL_ASSERT(dcomp < mf.nComp());

    const int ngrow = mf.nGrow();

    int index, scomp, ncomp;

    if (isStateVariable(name,index,scomp))
    {
        FillPatch(*this,mf,ngrow,time,index,scomp,1,dcomp);
    }
    else if (const DeriveRec* rec = derive_lst.get(name))
    {
        rec->getRange(0,index,scomp,ncomp);

        const BoxArray& srcBA = state[index].boxArray();

        int ngrow_src = ngrow;
        {
            Box bx0 = srcBA[0];
            Box bx1 = rec->boxMap()(bx0);
            int g = bx0.smallEnd(0) - bx1.smallEnd(0);
            ngrow_src += g;
        }

        MultiFab srcMF(srcBA,dmap,rec->numState(),ngrow_src, MFInfo(), *m_factory);

        for (int k = 0, dc = 0; k < rec->numRange(); k++, dc += ncomp)
        {
            rec->getRange(k,index,scomp,ncomp);

            FillPatch(*this,srcMF,ngrow_src,time,index,scomp,ncomp,dc);
        }

        if (rec->derFuncFab() != nullptr)
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox();
                FArrayBox& derfab = mf[mfi];
                FArrayBox const& datafab = srcMF[mfi];
                const int dncomp = rec->numDerive();
                rec->derFuncFab()(bx, derfab, dcomp, dncomp, datafab, geom, time, rec->getBC(), level);
            }
        }
        else
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(mf,true); mfi.isValid(); ++mfi)
        {
            int         idx     = mfi.index();
            Real*       ddat    = mf[mfi].dataPtr(dcomp);
            const int*  dlo     = mf[mfi].loVect();
            const int*  dhi     = mf[mfi].hiVect();
            const Box&  gtbx    = mfi.growntilebox();
            const int*  lo      = gtbx.loVect();
            const int*  hi      = gtbx.hiVect();
            int         n_der   = rec->numDerive();
            Real*       cdat    = srcMF[mfi].dataPtr();
            const int*  clo     = srcMF[mfi].loVect();
            const int*  chi     = srcMF[mfi].hiVect();
            int         n_state = rec->numState();
            const int*  dom_lo  = state[index].getDomain().loVect();
            const int*  dom_hi  = state[index].getDomain().hiVect();
            const Real* dx      = geom.CellSize();
            const int*  bcr     = rec->getBC();
            const RealBox& temp = RealBox(gtbx,geom.CellSize(),geom.ProbLo());
            const Real* xlo     = temp.lo();
            Real        dt      = parent->dtLevel(level);

            if (rec->derFunc() != static_cast<DeriveFunc>(0)){
               rec->derFunc()(ddat,AMREX_ARLIM(dlo),AMREX_ARLIM(dhi),&n_der,
                              cdat,AMREX_ARLIM(clo),AMREX_ARLIM(chi),&n_state,
                              lo,hi,dom_lo,dom_hi,dx,xlo,&time,&dt,bcr,
                              &level,&idx);
            } else if (rec->derFunc3D() != static_cast<DeriveFunc3D>(0)){
               const int *bc3D = rec->getBC3D();
               rec->derFunc3D()(ddat,AMREX_ARLIM_3D(dlo),AMREX_ARLIM_3D(dhi),&n_der,
                                cdat,AMREX_ARLIM_3D(clo),AMREX_ARLIM_3D(chi),&n_state,
                                AMREX_ARLIM_3D(lo),AMREX_ARLIM_3D(hi),
                                AMREX_ARLIM_3D(dom_lo),AMREX_ARLIM_3D(dom_hi),
                                AMREX_ZFILL(dx),AMREX_ZFILL(xlo),
                                &time,&dt,
                                bc3D,
                                &level,&idx);
            } else {
               amrex::Error("AmrLevel::derive: no function available");
            }
        }
        }
    }
    else
    {
        //
        // If we got here, cannot derive given name.
        //
        std::string msg("AmrLevel::derive(MultiFab*): unknown variable: ");
        msg += name;
        amrex::Error(msg.c_str());
    }
}